

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

void __thiscall
vkt::image::anon_unknown_0::ImageLoadStoreTestInstance::commandBindDescriptorsForLayer
          (ImageLoadStoreTestInstance *this,VkCommandBuffer cmdBuffer,
          VkPipelineLayout pipelineLayout,int layerNdx)

{
  VkDescriptorSet destSet;
  VkDevice device;
  DeviceInterface *vk;
  DescriptorSetUpdateBuilder *pDVar1;
  VkDescriptorSet descriptorSet;
  VkDescriptorImageInfo descriptorDstImageInfo;
  Location local_a0;
  Location local_98;
  DescriptorSetUpdateBuilder local_90;
  VkDescriptorImageInfo descriptorSrcImageInfo;
  
  device = Context::getDevice((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                              super_TestInstance.m_context);
  vk = Context::getDeviceInterface
                 ((this->super_LoadStoreTestInstance).super_BaseTestInstance.super_TestInstance.
                  m_context);
  destSet.m_internal =
       *(deUint64 *)
        &(((this->m_allDescriptorSets).
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[layerNdx].m_ptr)->
         super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data;
  descriptorSrcImageInfo.imageView.m_internal =
       *(deUint64 *)
        &(((this->m_allSrcImageViews).
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[layerNdx].m_ptr)->
         super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data;
  descriptorDstImageInfo.imageView.m_internal =
       *(deUint64 *)
        &(((this->m_allDstImageViews).
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[layerNdx].m_ptr)->
         super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data;
  descriptorSrcImageInfo.sampler.m_internal = 0;
  descriptorDstImageInfo.sampler.m_internal = 0;
  descriptorDstImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
  descriptorSet.m_internal = destSet.m_internal;
  descriptorSrcImageInfo.imageLayout = descriptorDstImageInfo.imageLayout;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_90);
  local_98.m_binding = 0;
  local_98.m_arrayElement = 0;
  pDVar1 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (&local_90,destSet,&local_98,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                      &descriptorSrcImageInfo);
  local_a0.m_binding = 1;
  local_a0.m_arrayElement = 0;
  pDVar1 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (pDVar1,destSet,&local_a0,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                      &descriptorDstImageInfo);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar1,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_90);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,cmdBuffer,1,pipelineLayout.m_internal,0,1,&descriptorSet,0,0);
  return;
}

Assistant:

void ImageLoadStoreTestInstance::commandBindDescriptorsForLayer (const VkCommandBuffer cmdBuffer, const VkPipelineLayout pipelineLayout, const int layerNdx)
{
	const VkDevice			device	= m_context.getDevice();
	const DeviceInterface&	vk		= m_context.getDeviceInterface();

	const VkDescriptorSet descriptorSet = **m_allDescriptorSets[layerNdx];
	const VkImageView	  srcImageView	= **m_allSrcImageViews[layerNdx];
	const VkImageView	  dstImageView	= **m_allDstImageViews[layerNdx];

	const VkDescriptorImageInfo descriptorSrcImageInfo = makeDescriptorImageInfo(DE_NULL, srcImageView, VK_IMAGE_LAYOUT_GENERAL);
	const VkDescriptorImageInfo descriptorDstImageInfo = makeDescriptorImageInfo(DE_NULL, dstImageView, VK_IMAGE_LAYOUT_GENERAL);

	DescriptorSetUpdateBuilder()
		.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorSrcImageInfo)
		.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorDstImageInfo)
		.update(vk, device);
	vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
}